

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O3

lzma_ret lzma_properties_encode(lzma_filter *filter,uint8_t *props)

{
  code *UNRECOVERED_JUMPTABLE;
  lzma_ret lVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(lzma_vli *)((long)&encoders[0].id + lVar2) == filter->id) {
      UNRECOVERED_JUMPTABLE = *(code **)((long)&encoders[0].props_encode + lVar2);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        lVar1 = (*UNRECOVERED_JUMPTABLE)(filter->options);
        return lVar1;
      }
      return LZMA_OK;
    }
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0x1f8);
  return LZMA_PROG_ERROR;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_encode(const lzma_filter *filter, uint8_t *props)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL)
		return LZMA_PROG_ERROR;

	if (fe->props_encode == NULL)
		return LZMA_OK;

	return fe->props_encode(filter->options, props);
}